

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowFontAtlas(ImFontAtlas *atlas)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImFont *font;
  bool bVar3;
  long lVar4;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec4 local_38;
  ImVec4 local_28;
  
  if (0 < (atlas->Fonts).Size) {
    lVar4 = 0;
    do {
      font = (atlas->Fonts).Data[lVar4];
      PushID(font);
      DebugNodeFont(font);
      PopID();
      lVar4 = lVar4 + 1;
    } while (lVar4 < (atlas->Fonts).Size);
  }
  bVar3 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)(uint)atlas->TexWidth,
                   (ulong)(uint)atlas->TexHeight);
  if (bVar3) {
    local_28.x = 1.0;
    local_28.y = 1.0;
    local_28.z = 1.0;
    local_28.w = 1.0;
    local_38.x = 1.0;
    local_38.y = 1.0;
    local_38.z = 1.0;
    local_38.w = 0.5;
    uVar1 = atlas->TexWidth;
    uVar2 = atlas->TexHeight;
    local_40.y = (float)(int)uVar2;
    local_40.x = (float)(int)uVar1;
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_50.x = 1.0;
    local_50.y = 1.0;
    Image(atlas->TexID,&local_40,&local_48,&local_50,&local_28,&local_38);
    TreePop();
  }
  return;
}

Assistant:

void ImGui::ShowFontAtlas(ImFontAtlas* atlas)
{
    for (int i = 0; i < atlas->Fonts.Size; i++)
    {
        ImFont* font = atlas->Fonts[i];
        PushID(font);
        DebugNodeFont(font);
        PopID();
    }
    if (TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
    {
        ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
        ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
        Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0.0f, 0.0f), ImVec2(1.0f, 1.0f), tint_col, border_col);
        TreePop();
    }
}